

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cc
# Opt level: O2

void __thiscall tt::net::EventLoopThread::EventLoopThread(EventLoopThread *this)

{
  _Bind<void_(tt::net::EventLoopThread::*(tt::net::EventLoopThread_*))()> local_78;
  ThreadFunc local_60;
  string local_40;
  allocator local_19;
  
  this->m_loop = (EventLoop *)0x0;
  this->m_exiting = false;
  local_78._M_f = (offset_in_EventLoopThread_to_subr)threadFunc;
  local_78._8_8_ = 0;
  local_78._M_bound_args.super__Tuple_impl<0UL,_tt::net::EventLoopThread_*>.
  super__Head_base<0UL,_tt::net::EventLoopThread_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_tt::net::EventLoopThread_*>)
       (_Tuple_impl<0UL,_tt::net::EventLoopThread_*>)this;
  std::function<void()>::
  function<std::_Bind<void(tt::net::EventLoopThread::*(tt::net::EventLoopThread*))()>,void>
            ((function<void()> *)&local_60,&local_78);
  std::__cxx11::string::string((string *)&local_40,"EventLoopThread",&local_19);
  Thread::Thread(&this->m_thread,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  MutexLock::MutexLock(&this->m_mutex);
  Condition::Condition(&this->m_cond,&this->m_mutex);
  return;
}

Assistant:

EventLoopThread::EventLoopThread()
	:m_loop(NULL),
	m_exiting(false), //是否退出
	m_thread(std::bind(&EventLoopThread::threadFunc,this), "EventLoopThread"),
	m_mutex(),
	m_cond(m_mutex){
	
	
}